

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::set_ip_filter(torrent *this,shared_ptr<const_libtorrent::ip_filter> *ipf)

{
  ::std::__shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_ip_filter).
              super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>,
             &ipf->super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->field_0x5db & 2) == 0) {
    return;
  }
  ip_filter_updated(this);
  return;
}

Assistant:

void torrent::set_ip_filter(std::shared_ptr<const ip_filter> ipf)
	{
		m_ip_filter = std::move(ipf);
		if (!m_apply_ip_filter) return;
		ip_filter_updated();
	}